

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.h
# Opt level: O3

void __thiscall kiste::html::escape(html *this,char *c)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  char local_1;
  
  bVar1 = *c;
  poVar2 = this->_os;
  if (bVar1 < 0x27) {
    if (bVar1 == 0x22) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"&quot;",6);
      return;
    }
    if (bVar1 != 0x26) {
LAB_001023e9:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1,1);
      return;
    }
    pcVar3 = "&amp;";
  }
  else {
    if (bVar1 != 0x27) {
      if (bVar1 == 0x3e) {
        pcVar3 = "&gt;";
      }
      else {
        if (bVar1 != 0x3c) goto LAB_001023e9;
        pcVar3 = "&lt;";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,4);
      return;
    }
    pcVar3 = "&#39;";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,5);
  return;
}

Assistant:

auto escape(const char& c) -> void
    {
      switch (c)
      {
      case '<':
        _os << "&lt;";
        break;
      case '>':
        _os << "&gt;";
        break;
      case '\'':
        _os << "&#39;";
        break;
      case '"':
        _os << "&quot;";
        break;
      case '&':
        _os << "&amp;";
        break;
      default:
        _os << c;
      }
    }